

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lf_queue_tail_multiple_relaxed.h
# Opt level: O0

Allocation * __thiscall
density::detail::
LFQueue_Tail<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,void()>,density::basic_default_allocator<65536ul>,(density::concurrency_cardinality)1,(density::consistency_model)0>
::try_inplace_allocate_impl<(density::detail::LfQueue_ProgressGuarantee)0,1ul,true,0ul,1ul>
          (Allocation *__return_storage_ptr__,void *this)

{
  uintptr_t i_control_block;
  bool bVar1;
  void *i_user_storage;
  unsigned_long uVar2;
  unsigned_long uVar3;
  uintptr_t uVar4;
  ControlBlock *pCVar5;
  uintptr_t next_ptr;
  ControlBlock *new_block;
  uintptr_t new_tail_offset;
  uintptr_t page_start;
  void *user_storage;
  uintptr_t new_tail;
  uintptr_t tail;
  bool over_aligned;
  undefined8 uStack_70;
  bool can_fit_in_a_page;
  size_t size;
  size_t alignment;
  void *pvStack_58;
  LfQueue_ProgressGuarantee guarantee;
  LFQueue_Tail<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_void_()>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::consistency_model)0>
  *this_local;
  memory_order local_48;
  int local_44;
  memory_order __b;
  undefined1 local_31;
  unsigned_long local_30;
  undefined4 local_28;
  undefined4 local_24;
  unsigned_long local_20;
  uintptr_t *local_18;
  void *local_10;
  
  alignment._4_4_ = LfQueue_Throwing;
  size = 8;
  uStack_70 = 0;
  tail._7_1_ = 1;
  tail._6_1_ = 0;
  local_44 = 5;
  pvStack_58 = this;
  ___b = this;
  local_48 = std::operator&(memory_order_seq_cst,__memory_order_mask);
  if (local_44 - 1U < 2) {
    this_local = *this;
  }
  else if (local_44 == 5) {
    this_local = *this;
  }
  else {
    this_local = *this;
  }
  new_tail = (uintptr_t)this_local;
  while( true ) {
    while( true ) {
      if ((new_tail == 0) || (bVar1 = uint_is_aligned<unsigned_long>(new_tail,0x40), !bVar1)) {
        density_tests::detail::assert_failed<>
                  ("tail != 0 && uint_is_aligned(tail, s_alloc_granularity)",
                   "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/include/density/detail/lf_queue_tail_multiple_relaxed.h"
                   ,0xf7);
      }
      i_user_storage = (void *)(new_tail + 0x18);
      uVar2 = uint_upper_align<unsigned_long>((unsigned_long)i_user_storage,0x40);
      uVar3 = uint_lower_align<unsigned_long>(new_tail,0x10000);
      i_control_block = new_tail;
      if (uVar2 - uVar3 < 0xffc1) break;
      new_tail = LFQueue_Tail<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_void_()>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::consistency_model)0>
                 ::page_overflow((LFQueue_Tail<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_void_()>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::consistency_model)0>
                                  *)this,alignment._4_4_,new_tail);
      if ((alignment._4_4_ != LfQueue_Throwing) && (new_tail == 0)) {
        LFQueue_Base<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_void_()>,_density::basic_default_allocator<65536UL>,_density::detail::LFQueue_Tail<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_void_()>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::consistency_model)0>_>
        ::Allocation::Allocation(__return_storage_ptr__);
        return __return_storage_ptr__;
      }
    }
    local_18 = &new_tail;
    local_24 = 5;
    local_28 = 5;
    LOCK();
    uVar4 = *this;
    local_31 = new_tail == uVar4;
    if ((bool)local_31) {
      *(unsigned_long *)this = uVar2;
      uVar4 = new_tail;
    }
    UNLOCK();
    local_30 = uVar2;
    local_20 = uVar2;
    local_10 = this;
    if ((bool)local_31) break;
    new_tail = uVar4;
    if (alignment._4_4_ == LfQueue_WaitFree) {
      LFQueue_Base<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_void_()>,_density::basic_default_allocator<65536UL>,_density::detail::LFQueue_Tail<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_void_()>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::consistency_model)0>_>
      ::Allocation::Allocation(__return_storage_ptr__);
      return __return_storage_ptr__;
    }
  }
  uVar4 = raw_atomic_load((uintptr_t *)new_tail,memory_order_seq_cst);
  if (uVar4 != 0) {
    density_tests::detail::assert_failed<>
              ("raw_atomic_load(&new_block->m_next, mem_relaxed) == 0",
               "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/include/density/detail/lf_queue_tail_multiple_relaxed.h"
               ,0x11c);
  }
  raw_atomic_store((uintptr_t *)i_control_block,uVar2 + 1,memory_order_seq_cst);
  pCVar5 = LFQueue_Base<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_void_()>,_density::basic_default_allocator<65536UL>,_density::detail::LFQueue_Tail<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_void_()>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::consistency_model)0>_>
           ::get_end_control_block((void *)i_control_block);
  if (pCVar5 <= i_control_block) {
    density_tests::detail::assert_failed<>
              ("new_block < get_end_control_block(new_block)",
               "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/include/density/detail/lf_queue_tail_multiple_relaxed.h"
               ,0x121);
  }
  LFQueue_Base<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_void_()>,_density::basic_default_allocator<65536UL>,_density::detail::LFQueue_Tail<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_void_()>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::consistency_model)0>_>
  ::Allocation::Allocation
            (__return_storage_ptr__,(LfQueueControl *)i_control_block,uVar2 + 1,i_user_storage);
  return __return_storage_ptr__;
}

Assistant:

Allocation try_inplace_allocate_impl() noexcept(PROGRESS_GUARANTEE != LfQueue_Throwing)
            {
                auto guarantee =
                  PROGRESS_GUARANTEE; // used to avoid warnings about constant conditional expressions

                static_assert(
                  (CONTROL_BITS & ~(LfQueue_Busy | LfQueue_Dead | LfQueue_External)) == 0,
                  "internal error");
                static_assert(
                  is_power_of_2(ALIGNMENT) && (SIZE % ALIGNMENT) == 0, "internal error");

                constexpr size_t alignment = size_max(ALIGNMENT, min_alignment);
                constexpr size_t size      = uint_upper_align(SIZE, alignment);
                constexpr bool   can_fit_in_a_page =
                  size + (alignment - min_alignment) <= s_max_size_inpage;
                constexpr bool over_aligned = alignment > min_alignment;

                /* Operations on m_tail are mostly relaxed, because the ordering is done when accessing
                the member m_next of the control blocks. */
                uintptr_t tail = m_tail.load(mem_relaxed);
                for (;;)
                {
                    DENSITY_ASSERT_INTERNAL(
                      tail != 0 && uint_is_aligned(tail, s_alloc_granularity));

                    // allocate space for the control block (and possibly the runtime type)
                    uintptr_t new_tail =
                      tail + (INCLUDE_TYPE ? s_element_min_offset : s_rawblock_min_offset);

                    // allocate the user space
                    if (over_aligned)
                        new_tail = uint_upper_align(new_tail, alignment);
                    DENSITY_ASSUME_UINT_ALIGNED(new_tail, alignment);
                    void * const user_storage = reinterpret_cast<void *>(new_tail);
                    new_tail = uint_upper_align(new_tail + SIZE, s_alloc_granularity);

                    // check for page overflow
                    uintptr_t const page_start =
                      uint_lower_align(tail, ALLOCATOR_TYPE::page_alignment);
                    DENSITY_ASSUME(new_tail > page_start);
                    uintptr_t const new_tail_offset = new_tail - page_start;
                    if (DENSITY_LIKELY(new_tail_offset <= s_end_control_offset))
                    {
                        /* No page overflow occurs with the new tail we have computed. */
                        if (m_tail.compare_exchange_weak(tail, new_tail, mem_relaxed, mem_relaxed))
                        {
                            /* At this point this thread has truncated the queue, because it has allocated
                            an element, but the member m_next of its control point is still zeroed (the
                            initial content of a newly allocated page).
                            Other threads may still put elements, but they will be not visible to the consumers
                            until the next store is completed. This is one of the reasons why this class
                            is not sequential consistent.

                            The next store is safe because the zeroed block is a barrier that consumers will
                            not get over, so this page can't be deallocated. If this block does not have the
                            dead 'flag', the access to this page is safe until the element is committed or canceled. */

                            // initialize the control block
                            auto const new_block = reinterpret_cast<ControlBlock *>(tail);
                            DENSITY_ASSERT_INTERNAL(
                              raw_atomic_load(&new_block->m_next, mem_relaxed) == 0);
                            uintptr_t const next_ptr = new_tail + CONTROL_BITS;
                            raw_atomic_store(&new_block->m_next, next_ptr, mem_relaxed);

                            // successful
                            DENSITY_ASSERT_INTERNAL(new_block < get_end_control_block(new_block));
                            return {new_block, next_ptr, user_storage};
                        }
                        else
                        {
                            if (guarantee == LfQueue_WaitFree)
                            {
                                // don't retry
                                return Allocation{};
                            }
                        }
                    }
                    else if (can_fit_in_a_page) // if this allocation may fit in a page
                    {
                        tail = page_overflow(guarantee, tail);
                        if (guarantee != LfQueue_Throwing)
                        {
                            if (tail == 0)
                            {
                                return Allocation{};
                            }
                        }
                        else
                        {
                            DENSITY_ASSUME(tail != 0);
                        }
                    }
                    else // this allocation would never fit in a page, allocate an external block
                    {
                        // legacy heap allocations can only be blocking
                        if (guarantee == LfQueue_LockFree || guarantee == LfQueue_WaitFree)
                            return Allocation{};

                        return Base::template external_allocate<PROGRESS_GUARANTEE>(
                          CONTROL_BITS, SIZE, ALIGNMENT);
                    }
                }
            }